

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManHasDangling(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManObj(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pGVar3;
    *(ulong *)pGVar3 = uVar1 & 0xffffffffbfffffff;
    uVar4 = uVar1 & 0x1fffffff;
    if (uVar4 == 0x1fffffff || -1 < (int)uVar1) {
      iVar2 = Gia_ObjIsMux(p,pGVar3);
      uVar1 = *(ulong *)pGVar3;
      if (iVar2 != 0) {
        pGVar3[-(uVar1 & 0x1fffffff)].field_0x3 = pGVar3[-(uVar1 & 0x1fffffff)].field_0x3 | 0x40;
        *(ulong *)(pGVar3 + -((ulong)*(uint *)&pGVar3->field_0x4 & 0x1fffffff)) =
             *(ulong *)(pGVar3 + -((ulong)*(uint *)&pGVar3->field_0x4 & 0x1fffffff)) | 0x40000000;
        pGVar3 = Gia_ObjFanin2(p,pGVar3);
        goto LAB_0061a024;
      }
      if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
        pGVar3[-(uVar1 & 0x1fffffff)].field_0x3 = pGVar3[-(uVar1 & 0x1fffffff)].field_0x3 | 0x40;
        uVar4 = (ulong)(*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
        goto LAB_0061a01a;
      }
    }
    else {
LAB_0061a01a:
      pGVar3 = pGVar3 + -uVar4;
LAB_0061a024:
      pGVar3->field_0x3 = pGVar3->field_0x3 | 0x40;
    }
  }
  iVar5 = 0;
  for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar3 = Gia_ManObj(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar5 = iVar5 + (uint)((*(ulong *)pGVar3 & 0xc0000000) == 0 &&
                          (~(uint)*(ulong *)pGVar3 & 0x1fffffff) != 0);
  }
  Gia_ManCleanMark0(p);
  return iVar5;
}

Assistant:

int Gia_ManHasDangling( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
        else if ( Gia_ObjIsMux(p, pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
            Gia_ObjFanin2(p, pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
    }
    Gia_ManForEachAnd( p, pObj, i )
        Counter += !pObj->fMark0;
    Gia_ManCleanMark0( p );
    return Counter;
}